

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * nlohmann::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/olkravi[P]lab-01-parser/include/json.hpp"
                  ,0x351e,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (0 < max_exp) {
    uVar1 = decimal_exponent + len;
    if (max_exp < (int)uVar1 || decimal_exponent < 0) {
      if ((int)uVar1 < 1 || max_exp < (int)uVar1) {
        if ((int)uVar1 <= min_exp || 0 < (int)uVar1) {
          if (len != 1) {
            memmove(buf + 2,buf + 1,(long)(len + -1));
            buf[1] = '.';
            buf = buf + len;
          }
          buf[1] = 'e';
          pcVar3 = append_exponent(buf + 2,uVar1 - 1);
          return pcVar3;
        }
        memmove(buf + (2 - uVar1),buf,(long)len);
        buf[0] = '0';
        buf[1] = '.';
        memset(buf + 2,0x30,(ulong)-uVar1);
        pcVar2 = buf + (int)((2 - uVar1) + len);
      }
      else {
        if (-1 < decimal_exponent) {
          __assert_fail("k > n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/olkravi[P]lab-01-parser/include/json.hpp"
                        ,0x3539,
                        "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)"
                       );
        }
        memmove(buf + uVar1 + 1,buf + uVar1,(long)-decimal_exponent);
        buf[uVar1] = '.';
        pcVar2 = buf + (long)len + 1;
      }
    }
    else {
      memset(buf + len,0x30,(ulong)(uint)decimal_exponent);
      pcVar3 = buf + (int)uVar1;
      pcVar2 = pcVar3 + 2;
      pcVar3[0] = '.';
      pcVar3[1] = '0';
    }
    return pcVar2;
  }
  __assert_fail("max_exp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olkravi[P]lab-01-parser/include/json.hpp"
                ,0x351f,
                "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    assert(min_exp < 0);
    assert(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n and n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n - k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (n + 2);
    }

    if (0 < n and n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        assert(k > n);

        std::memmove(buf + (n + 1), buf + n, static_cast<size_t>(k - n));
        buf[n] = '.';
        return buf + (k + 1);
    }

    if (min_exp < n and n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + -n), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2 + (-n) + k);
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k - 1));
        buf[1] = '.';
        buf += 1 + k;
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}